

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O3

vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *
SetupDummyInputs(vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                 *__return_storage_ptr__,FillableSigningProvider *keystoreRet,
                CCoinsViewCache *coinsRet,array<long,_4UL> *nValues)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long lVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  int i;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  CKey *this;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  CKey key [4];
  undefined1 local_170 [16];
  pointer local_160;
  pointer local_12c;
  pointer pCStack_124;
  uchar local_11c [4];
  direct_or_indirect local_118;
  undefined4 local_fc;
  undefined1 local_f8 [72];
  uchar local_b0;
  CKey local_78;
  CKey local_68;
  CKey local_58;
  CKey local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::resize
            (__return_storage_ptr__,2);
  lVar4 = 0;
  do {
    (&local_78.fCompressed)[lVar4] = false;
    *(undefined8 *)
     ((long)&local_78.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + lVar4)
         = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  this = &local_78;
  lVar4 = 0;
  do {
    CKey::MakeNewKey(this,(bool)((byte)lVar4 & 1));
    (*(keystoreRet->super_SigningProvider)._vptr_SigningProvider[0xb])(keystoreRet,this);
    lVar4 = lVar4 + 1;
    this = this + 1;
  } while (lVar4 != 4);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&((__return_storage_ptr__->
               super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
               _M_impl.super__Vector_impl_data._M_start)->vout,2);
  plVar2 = *(long **)&(((__return_storage_ptr__->
                        super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                        )._M_impl.super__Vector_impl_data._M_start)->vout).
                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data;
  *plVar2 = nValues->_M_elems[0];
  CKey::GetPubKey((CPubKey *)local_f8,&local_78);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,(CPubKey *)local_f8)
  ;
  b._M_extent._M_extent_value = local_170._8_8_ - local_170._0_8_;
  b._M_ptr = (pointer)local_170._0_8_;
  ppVar5 = &CScript::operator<<((CScript *)(plVar2 + 1),b)->super_CScriptBase;
  uVar1 = ppVar5->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar5->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar6 = ppVar5;
  }
  local_118.direct[0] = -0x54;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar5,(uchar *)((long)&ppVar6->_union + (long)(int)uVar3),(uchar *)local_118.direct);
  if ((pointer)local_170._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_170._0_8_,(long)local_160 - local_170._0_8_);
  }
  lVar4 = *(long *)&(((__return_storage_ptr__->
                      super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)
                      ._M_impl.super__Vector_impl_data._M_start)->vout).
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data;
  *(long *)(lVar4 + 0x28) = nValues->_M_elems[1];
  CKey::GetPubKey((CPubKey *)local_f8,&local_68);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,(CPubKey *)local_f8)
  ;
  b_00._M_extent._M_extent_value = local_170._8_8_ - local_170._0_8_;
  b_00._M_ptr = (pointer)local_170._0_8_;
  ppVar5 = &CScript::operator<<((CScript *)(lVar4 + 0x30),b_00)->super_CScriptBase;
  uVar1 = ppVar5->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar5->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar6 = ppVar5;
  }
  local_118.direct[0] = -0x54;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar5,(uchar *)((long)&ppVar6->_union + (long)(int)uVar3),(uchar *)local_118.direct);
  if ((pointer)local_170._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_170._0_8_,(long)local_160 - local_170._0_8_);
  }
  CTransaction::CTransaction
            ((CTransaction *)local_f8,
             (__return_storage_ptr__->
             super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
             super__Vector_impl_data._M_start);
  AddCoins(coinsRet,(CTransaction *)local_f8,0,false);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&(__return_storage_ptr__->
              super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl
              .super__Vector_impl_data._M_start[1].vout,2);
  **(long **)&(__return_storage_ptr__->
              super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl
              .super__Vector_impl_data._M_start[1].vout.
              super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data =
       nValues->_M_elems[2];
  CKey::GetPubKey((CPubKey *)local_170,&local_58);
  PKHash::PKHash((PKHash *)&local_12c,(CPubKey *)local_170);
  local_f8[0x10] = local_11c[0];
  local_f8[0x11] = local_11c[1];
  local_f8[0x12] = local_11c[2];
  local_f8[0x13] = local_11c[3];
  local_f8._0_8_ = local_12c;
  local_f8._8_8_ = pCStack_124;
  local_b0 = '\x02';
  GetScriptForDestination((CScript *)&local_118.indirect_contents,(CTxDestination *)local_f8);
  lVar4 = *(long *)&(__return_storage_ptr__->
                    super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
                    _M_impl.super__Vector_impl_data._M_start[1].vout.
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data;
  if (0x1c < *(uint *)(lVar4 + 0x24)) {
    free(*(void **)(lVar4 + 8));
  }
  *(ulong *)(lVar4 + 0x14) = CONCAT44(local_118._16_4_,local_118._12_4_);
  *(undefined8 *)(lVar4 + 0x1c) = local_118._20_8_;
  *(ulong *)(lVar4 + 8) = CONCAT71(local_118._1_7_,local_118.direct[0]);
  *(ulong *)(lVar4 + 0x10) = CONCAT44(local_118._12_4_,local_118.indirect_contents.capacity);
  *(undefined4 *)(lVar4 + 0x24) = local_fc;
  local_fc = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_f8);
  *(long *)(*(long *)&(__return_storage_ptr__->
                      super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)
                      ._M_impl.super__Vector_impl_data._M_start[1].vout.
                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data + 0x28) = nValues->_M_elems[3];
  CKey::GetPubKey((CPubKey *)local_170,&local_48);
  PKHash::PKHash((PKHash *)&local_12c,(CPubKey *)local_170);
  local_f8[0x10] = local_11c[0];
  local_f8[0x11] = local_11c[1];
  local_f8[0x12] = local_11c[2];
  local_f8[0x13] = local_11c[3];
  local_f8._0_8_ = local_12c;
  local_f8._8_8_ = pCStack_124;
  local_b0 = '\x02';
  GetScriptForDestination((CScript *)&local_118.indirect_contents,(CTxDestination *)local_f8);
  lVar4 = *(long *)&(__return_storage_ptr__->
                    super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
                    _M_impl.super__Vector_impl_data._M_start[1].vout.
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data;
  if (0x1c < *(uint *)(lVar4 + 0x4c)) {
    free(*(void **)(lVar4 + 0x30));
  }
  *(ulong *)(lVar4 + 0x3c) = CONCAT44(local_118._16_4_,local_118._12_4_);
  *(undefined8 *)(lVar4 + 0x44) = local_118._20_8_;
  *(ulong *)(lVar4 + 0x30) = CONCAT71(local_118._1_7_,local_118.direct[0]);
  *(ulong *)(lVar4 + 0x38) = CONCAT44(local_118._12_4_,local_118.indirect_contents.capacity);
  *(undefined4 *)(lVar4 + 0x4c) = local_fc;
  local_fc = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_f8);
  CTransaction::CTransaction
            ((CTransaction *)local_f8,
             (__return_storage_ptr__->
             super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
             super__Vector_impl_data._M_start + 1);
  AddCoins(coinsRet,(CTransaction *)local_f8,0,false);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f8);
  lVar4 = 0x38;
  do {
    if (*(array<unsigned_char,_32UL> **)(&local_78.fCompressed + lVar4) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&local_78.fCompressed + lVar4),
                 *(array<unsigned_char,_32UL> **)(&local_78.fCompressed + lVar4));
    }
    *(undefined8 *)(&local_78.fCompressed + lVar4) = 0;
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CMutableTransaction> SetupDummyInputs(FillableSigningProvider& keystoreRet, CCoinsViewCache& coinsRet, const std::array<CAmount,4>& nValues)
{
    std::vector<CMutableTransaction> dummyTransactions;
    dummyTransactions.resize(2);

    // Add some keys to the keystore:
    CKey key[4];
    for (int i = 0; i < 4; i++) {
        key[i].MakeNewKey(i % 2);
        keystoreRet.AddKey(key[i]);
    }

    // Create some dummy input transactions
    dummyTransactions[0].vout.resize(2);
    dummyTransactions[0].vout[0].nValue = nValues[0];
    dummyTransactions[0].vout[0].scriptPubKey << ToByteVector(key[0].GetPubKey()) << OP_CHECKSIG;
    dummyTransactions[0].vout[1].nValue = nValues[1];
    dummyTransactions[0].vout[1].scriptPubKey << ToByteVector(key[1].GetPubKey()) << OP_CHECKSIG;
    AddCoins(coinsRet, CTransaction(dummyTransactions[0]), 0);

    dummyTransactions[1].vout.resize(2);
    dummyTransactions[1].vout[0].nValue = nValues[2];
    dummyTransactions[1].vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[2].GetPubKey()));
    dummyTransactions[1].vout[1].nValue = nValues[3];
    dummyTransactions[1].vout[1].scriptPubKey = GetScriptForDestination(PKHash(key[3].GetPubKey()));
    AddCoins(coinsRet, CTransaction(dummyTransactions[1]), 0);

    return dummyTransactions;
}